

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSize.cpp
# Opt level: O0

void testSize(void)

{
  ostream *poVar1;
  ptrdiff_t algn;
  int size;
  half h [2];
  
  std::operator<<((ostream *)&std::cout,"size and alignment\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"sizeof  (half) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"alignof (half) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testSize ()
{
    cout << "size and alignment\n";

    half h[2];

    int size = sizeof (half);
    ptrdiff_t algn = (char *)&h[1] - (char *)&h[0];

    cout << "sizeof  (half) = " << size << endl;
    cout << "alignof (half) = " << (int) algn << endl;

    assert (size == 2 && algn == 2);

    cout << "ok\n\n" << flush;
}